

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_registry.c
# Opt level: O1

int curious_register_file_by_fd(int fd)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  char fd_path [22];
  char *mount_point;
  char *filesystem;
  char buf [256];
  char local_158 [32];
  char *local_138;
  char *local_130;
  char local_128 [256];
  
  if (fd < 0) {
    iVar5 = -1;
  }
  else {
    builtin_strncpy(local_158,"/proc/self/fd/",0xf);
    builtin_strncpy(local_158 + 0xf,"      ",7);
    sVar2 = strlen(local_158);
    iVar5 = 0;
    uVar1 = snprintf(local_158 + sVar2,6,"%d",fd);
    if (5 < uVar1) {
      fprintf(_stderr,"Warning! err code: %i. fd (%i) may be truncated in fd_path (%s)\n",
              (ulong)uVar1,fd,local_158);
    }
    uVar3 = readlink(local_158,local_128,0x100);
    uVar4 = 0xff;
    if (uVar3 < 0xff) {
      uVar4 = uVar3;
    }
    local_128[uVar4] = '\0';
    curious_get_filesystem(local_128,&local_130,&local_138);
    curious_register_file(local_128,fd,local_130,local_138);
  }
  return iVar5;
}

Assistant:

int curious_register_file_by_fd(int fd)
{
    if (fd < 0) {
        return -1;
    }

// Setup the basic I/O files
// Assume we have at most a 6 digit file descriptor, since we can spare a few bytes
#define DIGITS 6
    char   fd_path[] = "/proc/self/fd/\0      ";
    size_t len       = strlen(fd_path);

// We make the assumption that the mount will be in the first 256 bytes,
// since that's longer than any line in /proc/mounts
#define BUF_SIZE 256
    char buf[BUF_SIZE];

    // append fd to fd_path
    int trunc_ret = snprintf(fd_path + len, DIGITS, "%d", fd);
    if (trunc_ret < 0 || trunc_ret >= DIGITS)
        fprintf(stderr, "Warning! err code: %i. fd (%i) may be truncated in fd_path (%s)\n", trunc_ret, fd, fd_path);

    // see where the link stored at fd_path goes
    size_t bytes_written = readlink(fd_path, buf, BUF_SIZE);

    // readlink doesn't add a null terminator, so we should
    if (bytes_written < BUF_SIZE - 1) {
        buf[bytes_written] = '\0';
    } else {
        buf[BUF_SIZE - 1] = '\0';
    }

    // now register the file using that path
    char* filesystem;
    char* mount_point;
    curious_get_filesystem(buf, &filesystem, &mount_point);
    return curious_register_file(buf, fd, filesystem, mount_point);
}